

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellLinkHeader.cpp
# Opt level: O1

void __thiscall ShellLinkHeader::printHeader(ShellLinkHeader *this)

{
  uint uVar1;
  ostream *poVar2;
  ShellLinkHeader *pSVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_140;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_128;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_110;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_f8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_e0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  undefined1 local_80 [40];
  pointer local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"____________________ShellLinkHeader______________________",0x39)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"HeaderSize:                         ",0x24);
  *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_38,&this->HeaderSize);
  Utils::lenFourBytes(&local_38);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," bytes",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"LinkCLSID:                          ",0x24);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_50,&this->LinkCLSID);
  Utils::printSid(&local_50,0);
  if (local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"LinkFlags:                          ",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  pSVar3 = (ShellLinkHeader *)(local_80 + 0x18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pSVar3,&this->LinkFlags);
  uVar1 = Utils::vectFourBytesToUnsignedInt
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pSVar3,0);
  parseLinkFlags(pSVar3,uVar1);
  if ((pointer)local_80._24_8_ != (pointer)0x0) {
    operator_delete((void *)local_80._24_8_,(long)local_58 - local_80._24_8_);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"FileAttributes:                     ",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  pSVar3 = (ShellLinkHeader *)local_80;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pSVar3,&this->FileAttributes);
  uVar1 = Utils::vectFourBytesToUnsignedInt
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pSVar3,0);
  parseFileAttributesFlags(pSVar3,uVar1);
  if ((pointer)local_80._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ - local_80._0_8_);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"CreationTime:                       ",0x24);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_98,&this->CreationTime);
  Utils::getDateFromPos(&local_98,0);
  if (local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"AccessTime:                         ",0x24);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_b0,&this->AccessTime);
  Utils::getDateFromPos(&local_b0,0);
  if (local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"WriteTime:                          ",0x24);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_c8,&this->WriteTime);
  Utils::getDateFromPos(&local_c8,0);
  if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"FileSize:                           ",0x24);
  *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_e0,&this->FileSize);
  Utils::lenFourBytes(&local_e0);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," bytes",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (local_e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"IconIndex:                          ",0x24);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_f8,&this->IconIndex);
  Utils::print_vec(&local_f8);
  if (local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"ShowCommand:                        ",0x24);
  parseShowCommand(this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"HotKey:                             ",0x24);
  parseHotKeyFlags(this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Reserved1:                          ",0x24);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_110,&this->Reserved1);
  Utils::print_vec(&local_110);
  if (local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Reserved2:                          ",0x24);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_128,&this->Reserved2);
  Utils::print_vec(&local_128);
  if (local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Reserved3:                          ",0x24);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_140,&this->Reserved3);
  Utils::print_vec(&local_140);
  if (local_140.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_140.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_140.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"_________________________________________________________",0x39)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  return;
}

Assistant:

void ShellLinkHeader::printHeader(){
        cout << "____________________ShellLinkHeader______________________" << endl;
        cout << "HeaderSize:                         " << dec << Utils::lenFourBytes(HeaderSize) << " bytes" << endl;
        cout << "LinkCLSID:                          "; Utils::printSid(LinkCLSID, 0); cout << endl;
        cout << "LinkFlags:                          " << endl;
            ShellLinkHeader::parseLinkFlags(Utils::vectFourBytesToUnsignedInt(LinkFlags,0));
        cout << "FileAttributes:                     " << endl;
            ShellLinkHeader::parseFileAttributesFlags(Utils::vectFourBytesToUnsignedInt(FileAttributes,0));
        cout << "CreationTime:                       "; Utils::getDateFromPos(CreationTime, 0);
        cout << "AccessTime:                         "; Utils::getDateFromPos(AccessTime, 0);
        cout << "WriteTime:                          "; Utils::getDateFromPos(WriteTime, 0);
        cout << "FileSize:                           " << dec << Utils::lenFourBytes(FileSize) << " bytes" << endl;
        cout << "IconIndex:                          "; Utils::print_vec(IconIndex);
        cout << "ShowCommand:                        "; ShellLinkHeader::parseShowCommand();
        cout << "HotKey:                             "; ShellLinkHeader::parseHotKeyFlags();
        cout << "Reserved1:                          "; Utils::print_vec(Reserved1);
        cout << "Reserved2:                          "; Utils::print_vec(Reserved2);
        cout << "Reserved3:                          "; Utils::print_vec(Reserved3);
        cout << "_________________________________________________________" << endl;
    }